

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field_shared.h
# Opt level: O0

Element_conflict
Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::_multiply
          (Element_conflict element,Element_conflict v)

{
  undefined4 local_18;
  undefined4 local_14;
  Element_conflict temp_b;
  Element_conflict a;
  Element_conflict v_local;
  Element_conflict element_local;
  
  a = 0;
  local_14 = element;
  temp_b = v;
  while (local_14 != 0) {
    if ((local_14 & 1) != 0) {
      if (characteristic_ - a <= temp_b) {
        a = a - characteristic_;
      }
      a = temp_b + a;
    }
    local_14 = local_14 >> 1;
    local_18 = temp_b;
    if (characteristic_ - temp_b <= temp_b) {
      local_18 = temp_b - characteristic_;
    }
    temp_b = local_18 + temp_b;
  }
  return a;
}

Assistant:

static Element _multiply(Element element, Element v) {
    Element a = element;
    element = 0;
    Element temp_b;

    while (a != 0) {
      if (a & 1) {
        if (v >= characteristic_ - element) element -= characteristic_;
        element += v;
      }
      a >>= 1;

      temp_b = v;
      if (v >= characteristic_ - v) temp_b -= characteristic_;
      v += temp_b;
    }

    return element;
  }